

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall
helics::apps::Player::addMessage
          (Player *this,Time sendTime,Time actionTime,string_view src,string_view dest,
          string_view payload)

{
  basic_string_view<char,_std::char_traits<char>_> *__svt;
  reference pvVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  baseType in_RDX;
  baseType in_RSI;
  size_type in_RDI;
  SmallBuffer *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0x00000018;
  __svt = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0xb8);
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::size
            ((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
             (in_RDI + 0xb8));
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
  resize((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)in_RCX
         ,in_RDI);
  pvVar1 = CLI::std::
           vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::back
                     ((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                       *)this_00);
  (pvVar1->sendTime).internalTimeCode = in_RSI;
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::back
            ((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
             this_00);
  SmallBuffer::operator=(in_R8,in_RCX);
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::back
            ((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
             this_00);
  std::__cxx11::string::operator=(this_00,__svt);
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::back
            ((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
             this_00);
  std::__cxx11::string::operator=(this_00,__svt);
  pvVar1 = CLI::std::
           vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::back
                     ((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                       *)this_00);
  (pvVar1->mess).time.internalTimeCode = in_RDX;
  return;
}

Assistant:

void Player::addMessage(Time sendTime,
                        Time actionTime,
                        std::string_view src,
                        std::string_view dest,
                        std::string_view payload)
{
    messages.resize(messages.size() + 1);
    messages.back().sendTime = sendTime;
    messages.back().mess.data = payload;
    messages.back().mess.source = src;
    messages.back().mess.dest = dest;
    messages.back().mess.time = actionTime;
}